

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error-reporter.c++
# Opt level: O0

SourcePos __thiscall
capnp::compiler::LineBreakTable::toSourcePos(LineBreakTable *this,uint32_t byteOffset)

{
  SourcePos SVar1;
  uint uVar2;
  size_t sVar3;
  uint *puVar4;
  uint col;
  uint line;
  uint32_t byteOffset_local;
  LineBreakTable *this_local;
  
  col = byteOffset;
  _line = this;
  sVar3 = anon_unknown_2::findLargestElementBefore<unsigned_int>(&this->lineBreaks,&col);
  uVar2 = col;
  puVar4 = kj::Vector<unsigned_int>::operator[](&this->lineBreaks,sVar3 & 0xffffffff);
  SVar1.line = (int)sVar3;
  SVar1.byte = col;
  SVar1.column = uVar2 - *puVar4;
  return SVar1;
}

Assistant:

GlobalErrorReporter::SourcePos LineBreakTable::toSourcePos(uint32_t byteOffset) const {
  uint line = findLargestElementBefore(lineBreaks, byteOffset);
  uint col = byteOffset - lineBreaks[line];
  return GlobalErrorReporter::SourcePos { byteOffset, line, col };
}